

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O1

iterator * __thiscall
csv::CSVRow::iterator::operator++(iterator *__return_storage_ptr__,iterator *this,int param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  __return_storage_ptr__->daddy = this->daddy;
  (__return_storage_ptr__->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (__return_storage_ptr__->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  __return_storage_ptr__->i = this->i;
  operator++(this);
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVRow::iterator CSVRow::iterator::operator++(int) {
        // Post-increment operator
        auto temp = *this;
        this->operator++();
        return temp;
    }